

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_write_flush(PmInternal *midi,PmTimestamp timestamp)

{
  void *pvVar1;
  undefined4 uVar2;
  alsa_descriptor_type desc;
  PmTimestamp timestamp_local;
  PmInternal *midi_local;
  
  pvVar1 = midi->descriptor;
  if (pvVar1 == (void *)0x0) {
    midi_local._4_4_ = pmBadPtr;
  }
  else {
    uVar2 = snd_seq_drain_output(seq);
    *(undefined4 *)((long)pvVar1 + 0x18) = uVar2;
    if (*(int *)((long)pvVar1 + 0x18) < 0) {
      midi_local._4_4_ = pmHostError;
    }
    else {
      *(undefined4 *)((long)pvVar1 + 0x18) = 0;
      midi_local._4_4_ = pmNoData;
    }
  }
  return midi_local._4_4_;
}

Assistant:

static PmError alsa_write_flush(PmInternal *midi, PmTimestamp timestamp)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    VERBOSE printf("snd_seq_drain_output: 0x%p\n", seq);
    desc->error = snd_seq_drain_output(seq);
    if (desc->error < 0) return pmHostError;

    desc->error = pmNoError;
    return pmNoError;
}